

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatingCodec.cc
# Opt level: O3

size_t __thiscall
avro::parsing::ValidatingDecoder<avro::parsing::SimpleParser<avro::parsing::DummyHandler>_>::skipMap
          (ValidatingDecoder<avro::parsing::SimpleParser<avro::parsing::DummyHandler>_> *this)

{
  SimpleParser<avro::parsing::DummyHandler> *this_00;
  int iVar1;
  undefined4 extraout_var;
  
  this_00 = &this->parser;
  SimpleParser<avro::parsing::DummyHandler>::advance(this_00,sMapStart);
  iVar1 = (*((this->base).px)->_vptr_Decoder[0x15])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
              (&(this->parser).parsingStack.c);
  }
  else {
    SimpleParser<avro::parsing::DummyHandler>::setRepeatCount(this_00,CONCAT44(extraout_var,iVar1));
    SimpleParser<avro::parsing::DummyHandler>::skip(this_00,(this->base).px);
  }
  SimpleParser<avro::parsing::DummyHandler>::advance(this_00,sMapEnd);
  return 0;
}

Assistant:

size_t ValidatingDecoder<P>::skipMap()
{
    parser.advance(Symbol::sMapStart);
    size_t n = base->skipMap();
    if (n == 0) {
        parser.pop();
    } else {
        parser.setRepeatCount(n);
        parser.skip(*base);
    }
    parser.advance(Symbol::sMapEnd);
    return 0;
}